

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

FTexture * FTexture::CreateTexture(int lumpnum,int usetype)

{
  undefined2 uVar1;
  int iVar2;
  FTexture *pFVar3;
  long lVar4;
  double dVar5;
  FWadLump data;
  FWadLump FStack_68;
  
  if (lumpnum == -1) {
    pFVar3 = (FTexture *)0x0;
  }
  else {
    FWadCollection::OpenLumpNum(&FStack_68,&Wads,lumpnum);
    lVar4 = 8;
    do {
      iVar2 = *(int *)((long)&CreateTexture::CreateInfo[0].TryCreate + lVar4);
      if (iVar2 == usetype || iVar2 == 0) {
        pFVar3 = (FTexture *)(**(code **)((long)&PTR_typeinfo_0088cc78 + lVar4))(&FStack_68,lumpnum)
        ;
        if (pFVar3 != (FTexture *)0x0) {
          pFVar3->UseType = (BYTE)usetype;
          if (usetype != 2) goto LAB_0065e048;
          uVar1 = pFVar3->Width;
          if (pFVar3->Height == 0x80 && uVar1 == 0x80) {
            dVar5 = 2.0;
          }
          else {
            if (pFVar3->Height != 0x100 || uVar1 != 0x100) goto LAB_0065e048;
            dVar5 = 4.0;
          }
          (pFVar3->Scale).Y = dVar5;
          (pFVar3->Scale).X = dVar5;
          pFVar3->field_0x31 = pFVar3->field_0x31 | 4;
          goto LAB_0065e048;
        }
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 200);
    pFVar3 = (FTexture *)0x0;
LAB_0065e048:
    FWadLump::~FWadLump(&FStack_68);
  }
  return pFVar3;
}

Assistant:

FTexture * FTexture::CreateTexture (int lumpnum, int usetype)
{
	static TexCreateInfo CreateInfo[]={
		{ IMGZTexture_TryCreate,		TEX_Any },
		{ PNGTexture_TryCreate,			TEX_Any },
		{ JPEGTexture_TryCreate,		TEX_Any },
		{ DDSTexture_TryCreate,			TEX_Any },
		{ PCXTexture_TryCreate,			TEX_Any },
		{ TGATexture_TryCreate,			TEX_Any },
		{ RawPageTexture_TryCreate,		TEX_MiscPatch },
		{ FlatTexture_TryCreate,		TEX_Flat },
		{ PatchTexture_TryCreate,		TEX_Any },
		{ EmptyTexture_TryCreate,		TEX_Any },
		{ AutomapTexture_TryCreate,		TEX_MiscPatch },
		{ CELTexture_TryCreate,			TEX_Any },
	};

	if (lumpnum == -1) return NULL;

	FWadLump data = Wads.OpenLumpNum (lumpnum);

	for(size_t i = 0; i < countof(CreateInfo); i++)
	{
		if ((CreateInfo[i].usetype == usetype || CreateInfo[i].usetype == TEX_Any))
		{
			FTexture * tex = CreateInfo[i].TryCreate(data, lumpnum);
			if (tex != NULL) 
			{
				tex->UseType = usetype;
				if (usetype == FTexture::TEX_Flat) 
				{
					int w = tex->GetWidth();
					int h = tex->GetHeight();

					// Auto-scale flats with dimensions 128x128 and 256x256.
					// In hindsight, a bad idea, but RandomLag made it sound better than it really is.
					// Now we're stuck with this stupid behaviour.
					if (w==128 && h==128) 
					{
						tex->Scale.X = tex->Scale.Y = 2;
						tex->bWorldPanning = true;
					}
					else if (w==256 && h==256) 
					{
						tex->Scale.X = tex->Scale.Y = 4;
						tex->bWorldPanning = true;
					}
				}
				return tex;
			}
		}
	}
	return NULL;
}